

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_parser.cpp
# Opt level: O3

CommandPacket CommandParser::checkForCommands(DebugInterface *serialLog,NetInterface *wifi)

{
  int *piVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  WifiDebugOstream *this;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  size_type sVar10;
  int *piVar11;
  WifiDebugOstream log;
  WifiDebugOstream local_48;
  
  local_48.m_lastWasNewline = true;
  local_48.m_wifiDebug = wifi;
  local_48.m_serialDebug = serialLog;
  if (checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_ == '\0') {
    checkForCommands();
  }
  uVar8 = 0xffffffff00000000;
  iVar4 = (*wifi->_vptr_NetInterface[3])
                    (wifi,&local_48,
                     &checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
  sVar3 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_string_length;
  _Var2 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_dataplus;
  uVar9 = 0xc;
  if ((char)iVar4 != '\0') {
    if (checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_string_length != 0) {
      sVar10 = 0;
      do {
        iVar4 = tolower((int)_Var2._M_p[sVar10]);
        _Var2._M_p[sVar10] = (char)iVar4;
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
    }
    this = operator<<(&local_48,"Got: ");
    sVar3 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_string_length;
    _Var2 = checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_._M_dataplus;
    if (0 < (long)checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_.
                  _M_string_length) {
      sVar10 = 0;
      do {
        WifiDebugOstream::onechar(this,_Var2._M_p[sVar10]);
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
    }
    operator<<(this,"\n");
    piVar1 = DAT_00117128;
    if (commandTemplates != DAT_00117128) {
      piVar11 = commandTemplates + 9;
      do {
        lVar6 = std::__cxx11::string::find
                          ((char *)&checkForCommands(DebugInterface&,NetInterface&)::
                                    command_abi_cxx11_,*(ulong *)(piVar11 + -9),0);
        if (lVar6 == 0) {
          uVar9 = piVar11[-1];
          if (*piVar11 == 0) {
            uVar5 = process_int(&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_
                                ,*(long *)(piVar11 + -7) + 1);
            uVar8 = (ulong)uVar5 << 0x20;
          }
          break;
        }
        piVar7 = piVar11 + 1;
        piVar11 = piVar11 + 10;
      } while (piVar7 != piVar1);
    }
  }
  return (CommandPacket)(uVar9 | uVar8);
}

Assistant:

const CommandPacket checkForCommands( 
	DebugInterface& serialLog, 
	NetInterface& wifi  )
{
	CommandPacket result;
  
  WifiDebugOstream log( &serialLog, &wifi );

  // Read the first line of the request.  

  static std::string command;
  bool dataReady = wifi.getString( log, command );
  if ( !dataReady )
  {
    return result;
  }

  std::transform( command.begin(), command.end(), command.begin(), ::tolower);

  log << "Got: " << command << "\n";

  for ( const CommandTemplate& ct : commandTemplates )
  {
    if ( command.find(ct.inputCommand ) == 0 )
    {
      result.command = ct.outputCommand;
      if ( ct.hasArg == HasArg::Yes )
      {
        result.optionalArg =  process_int( command,  ct.inputCommand.length()+1  );
      } 
      return result;
    }
  } 
  return result;

}